

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O3

void __thiscall QGraphicsBlurEffect::setBlurRadius(QGraphicsBlurEffect *this,qreal radius)

{
  long lVar1;
  qreal qVar2;
  long in_FS_OFFSET;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  qreal local_30;
  void *local_28;
  qreal *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  qVar2 = QPixmapBlurFilter::radius(*(QPixmapBlurFilter **)(lVar1 + 0xa8));
  dVar6 = qVar2 - radius;
  uVar3 = -(ulong)(dVar6 < -dVar6);
  uVar4 = -(ulong)(qVar2 < -qVar2);
  uVar5 = -(ulong)(radius < -radius);
  dVar7 = (double)(~uVar4 & (ulong)qVar2 | (ulong)-qVar2 & uVar4);
  dVar8 = (double)(~uVar5 & (ulong)radius | (ulong)-radius & uVar5);
  if (dVar8 <= dVar7) {
    dVar7 = dVar8;
  }
  if (dVar7 < (double)(~uVar3 & (ulong)dVar6 | (ulong)-dVar6 & uVar3) * 1000000000000.0) {
    QPixmapBlurFilter::setRadius(*(QPixmapBlurFilter **)(lVar1 + 0xa8),radius);
    QGraphicsEffect::updateBoundingRect(&this->super_QGraphicsEffect);
    local_20 = &local_30;
    local_28 = (void *)0x0;
    local_30 = radius;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsBlurEffect::setBlurRadius(qreal radius)
{
    Q_D(QGraphicsBlurEffect);
    if (qFuzzyCompare(d->filter->radius(), radius))
        return;

    d->filter->setRadius(radius);
    updateBoundingRect();
    emit blurRadiusChanged(radius);
}